

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O0

uint64_t kratos::hash_64_fnv1a(void *key,uint64_t len)

{
  ulong uStack_38;
  uint8_t value;
  uint64_t i;
  uint64_t prime;
  uint64_t hash;
  char *data;
  uint64_t len_local;
  void *key_local;
  
  prime = 0xcbf29ce484222325;
  for (uStack_38 = 0; uStack_38 < len; uStack_38 = uStack_38 + 1) {
    prime = (prime ^ *(byte *)((long)key + uStack_38)) * 0x100000001b3;
  }
  return prime;
}

Assistant:

uint64_t hash_64_fnv1a(const void* key, uint64_t len) {
    auto const* data = static_cast<const char*>(key);
    uint64_t hash = 0xcbf29ce484222325;
    uint64_t prime = 0x100000001b3;

    for (uint64_t i = 0; i < len; ++i) {
        uint8_t value = data[i];
        hash = hash ^ value;
        hash *= prime;
    }

    return hash;

}